

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::FillForwardDeclarations
          (FileGenerator *this,ForwardDeclarations *decls)

{
  EnumGenerator *this_00;
  MessageGenerator *this_01;
  int iVar1;
  int iVar2;
  FileDescriptor *file;
  size_type sVar3;
  reference ns_name;
  reference ppEVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>_>
  *enum_names;
  reference ppMVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  *class_names;
  int local_240;
  int local_23c;
  int i_3;
  int i_2;
  int i_1;
  undefined1 local_228 [8];
  FileGenerator dependency;
  ForwardDeclarations *pFStack_18;
  int i;
  ForwardDeclarations *decls_local;
  FileGenerator *this_local;
  
  dependency.package_parts_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    iVar1 = dependency.package_parts_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    iVar2 = FileDescriptor::public_dependency_count(this->file_);
    if (iVar2 <= iVar1) break;
    file = FileDescriptor::public_dependency
                     (this->file_,
                      dependency.package_parts_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    FileGenerator((FileGenerator *)local_228,file,&this->options_);
    FillForwardDeclarations((FileGenerator *)local_228,decls);
    ~FileGenerator((FileGenerator *)local_228);
    dependency.package_parts_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         dependency.package_parts_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  i_3 = 0;
  pFStack_18 = decls;
  while( true ) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->package_parts_);
    if (sVar3 <= (ulong)(long)i_3) break;
    ns_name = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->package_parts_,(long)i_3);
    pFStack_18 = ForwardDeclarations::AddOrGetNamespace(pFStack_18,ns_name);
    i_3 = i_3 + 1;
  }
  local_23c = 0;
  while( true ) {
    sVar3 = std::
            vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
            ::size(&this->enum_generators_);
    if (sVar3 <= (ulong)(long)local_23c) break;
    ppEVar4 = std::
              vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
              ::operator[](&this->enum_generators_,(long)local_23c);
    this_00 = *ppEVar4;
    enum_names = ForwardDeclarations::enums_abi_cxx11_(pFStack_18);
    EnumGenerator::FillForwardDeclaration(this_00,enum_names);
    local_23c = local_23c + 1;
  }
  local_240 = 0;
  while( true ) {
    sVar3 = std::
            vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ::size(&this->message_generators_);
    if (sVar3 <= (ulong)(long)local_240) break;
    ppMVar5 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,(long)local_240);
    this_01 = *ppMVar5;
    class_names = ForwardDeclarations::classes_abi_cxx11_(pFStack_18);
    MessageGenerator::FillMessageForwardDeclarations(this_01,class_names);
    local_240 = local_240 + 1;
  }
  return;
}

Assistant:

void FileGenerator::FillForwardDeclarations(ForwardDeclarations* decls) {
  for (int i = 0; i < file_->public_dependency_count(); i++) {
    FileGenerator dependency(file_->public_dependency(i), options_);
    dependency.FillForwardDeclarations(decls);
  }
  for (int i = 0; i < package_parts_.size(); i++) {
    decls = decls->AddOrGetNamespace(package_parts_[i]);
  }
  // Generate enum definitions.
  for (int i = 0; i < enum_generators_.size(); i++) {
    enum_generators_[i]->FillForwardDeclaration(&decls->enums());
  }
  // Generate forward declarations of classes.
  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->FillMessageForwardDeclarations(
        &decls->classes());
  }
}